

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd.h
# Opt level: O3

void dump_fdtd(fdtd *fdtd,char *fileName,dumpable_data dd)

{
  fdtd_type fVar1;
  
  fVar1 = fdtd->type;
  if (fVar1 == fdtd_three_dims) {
    dump_3D_fdtd(&(fdtd->field_1).threeDims,fileName,dd);
    return;
  }
  if (fVar1 != fdtd_two_dims) {
    if (fVar1 == fdtd_one_dim) {
      dump_1D_fdtd(&(fdtd->field_1).oneDim,fileName,dd);
      return;
    }
    return;
  }
  dump_2D_fdtd(&(fdtd->field_1).twoDims,fileName,dd);
  return;
}

Assistant:

inline void dump_fdtd(const struct fdtd *fdtd, const char *fileName,
                      enum dumpable_data dd) {
  switch (fdtd->type) {
  case fdtd_one_dim:
    dump_1D_fdtd(&fdtd->oneDim, fileName, dd);
    break;
  case fdtd_two_dims:
    dump_2D_fdtd(&fdtd->twoDims, fileName, dd);
    break;
  case fdtd_three_dims:
    dump_3D_fdtd(&fdtd->threeDims, fileName, dd);
    break;
  }
}